

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  u8 *puVar4;
  bool bVar5;
  ushort uVar6;
  u16 uVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  ushort uVar11;
  undefined8 uVar12;
  ushort *puVar13;
  uint uVar14;
  uint uVar15;
  uint unaff_EBP;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  u8 *local_70;
  u8 *local_40;
  
  puVar4 = pPage->aData;
  uVar16 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar14 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar3 = pPage->pBt->usableSize;
  if ((int)(uint)puVar4[uVar16 + 7] <= nMaxFrag) {
    uVar6 = *(ushort *)(puVar4 + uVar16 + 1) << 8 | *(ushort *)(puVar4 + uVar16 + 1) >> 8;
    uVar12 = 0xfc73;
    if ((int)(uVar3 - 4) < (int)(uint)uVar6) {
LAB_0016642e:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
      iVar18 = 1;
    }
    else {
      uVar19 = (uint)uVar6;
      iVar18 = 0;
      if (uVar6 != 0) {
        uVar11 = *(ushort *)(puVar4 + uVar6) << 8 | *(ushort *)(puVar4 + uVar6) >> 8;
        uVar12 = 0xfc76;
        if ((int)(uint)uVar11 <= (int)(uVar3 - 4)) {
          uVar15 = (uint)uVar11;
          if ((uVar11 != 0) &&
             ((iVar18 = 0, puVar4[uVar11] != '\0' || (puVar4[(ulong)uVar11 + 1] != '\0'))))
          goto LAB_00166458;
          uVar8 = *(ushort *)(puVar4 + uVar16 + 5) << 8 | *(ushort *)(puVar4 + uVar16 + 5) >> 8;
          uVar12 = 0xfc7e;
          iVar18 = uVar19 - uVar8;
          if (uVar8 <= uVar19 && iVar18 != 0) {
            uVar9 = *(ushort *)(puVar4 + (ulong)uVar6 + 2) << 8 |
                    *(ushort *)(puVar4 + (ulong)uVar6 + 2) >> 8;
            unaff_EBP = (uint)uVar9;
            uVar10 = (uint)uVar6 + (uint)uVar9;
            if (uVar15 == 0) {
              uVar6 = 0;
              uVar12 = 0xfc87;
              uVar15 = unaff_EBP;
              if ((int)uVar10 <= (int)uVar3) {
LAB_0016677d:
                unaff_EBP = uVar15 + uVar8;
                memmove(puVar4 + unaff_EBP,puVar4 + uVar8,(long)iVar18);
                iVar18 = 5;
                if (uVar1 < uVar14) {
                  puVar13 = (ushort *)(puVar4 + uVar1);
                  do {
                    uVar9 = *puVar13 << 8 | *puVar13 >> 8;
                    uVar8 = (ushort)uVar15;
                    if ((uVar9 < uVar19) || (uVar8 = uVar6, (uint)uVar9 < (uint)uVar11)) {
                      *puVar13 = (uVar9 + uVar8) * 0x100 | (ushort)(uVar9 + uVar8) >> 8;
                    }
                    puVar13 = puVar13 + 1;
                    iVar18 = 5;
                  } while (puVar13 < puVar4 + uVar14);
                }
                goto LAB_00166458;
              }
            }
            else {
              uVar12 = 0xfc81;
              if (uVar10 <= uVar15) {
                uVar6 = *(ushort *)(puVar4 + (ulong)uVar11 + 2) << 8 |
                        *(ushort *)(puVar4 + (ulong)uVar11 + 2) >> 8;
                uVar12 = 0xfc83;
                if ((int)((uint)uVar6 + (uint)uVar11) <= (int)uVar3) {
                  memmove(puVar4 + (uVar6 + uVar10),puVar4 + uVar10,(long)(int)(uVar15 - uVar10));
                  uVar15 = (uint)uVar9 + (uint)uVar6;
                  goto LAB_0016677d;
                }
              }
            }
          }
        }
        goto LAB_0016642e;
      }
    }
LAB_00166458:
    if (iVar18 == 5) goto LAB_0016662a;
    if (iVar18 != 0) {
      return 0xb;
    }
  }
  unaff_EBP = uVar3;
  if ((ulong)uVar2 != 0) {
    uVar17 = 0;
    local_40 = (u8 *)0x0;
    local_70 = puVar4;
    do {
      uVar6 = *(ushort *)(puVar4 + uVar17 * 2 + (ulong)uVar1) << 8 |
              *(ushort *)(puVar4 + uVar17 * 2 + (ulong)uVar1) >> 8;
      if ((uVar6 < uVar14) ||
         (uVar19 = (uint)uVar6, uVar19 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar6)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfca3,
                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
        bVar5 = true;
      }
      else {
        uVar7 = (*pPage->xCellSize)(pPage,local_70 + uVar19);
        uVar15 = unaff_EBP - uVar7;
        if (((int)uVar15 < (int)uVar14) || ((int)uVar3 < (int)((uint)uVar6 + (uint)uVar7))) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfca9,
                      "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
          bVar5 = true;
          unaff_EBP = uVar15;
        }
        else {
          *(ushort *)(puVar4 + uVar17 * 2 + (ulong)uVar1) =
               (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
          if (local_40 == (u8 *)0x0) {
            if (uVar15 == uVar19) {
              bVar5 = false;
              local_40 = (u8 *)0x0;
              unaff_EBP = uVar15;
              goto LAB_001665fd;
            }
            local_70 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            uVar6 = *(ushort *)(puVar4 + uVar16 + 5) << 8 | *(ushort *)(puVar4 + uVar16 + 5) >> 8;
            memcpy(local_70 + uVar6,puVar4 + uVar6,(long)(int)(unaff_EBP - uVar6));
            local_40 = local_70;
          }
          memcpy(puVar4 + uVar15,local_70 + uVar19,(ulong)uVar7);
          bVar5 = false;
          unaff_EBP = uVar15;
        }
      }
LAB_001665fd:
      if (bVar5) {
        return 0xb;
      }
      uVar17 = uVar17 + 1;
    } while (uVar2 != uVar17);
  }
  puVar4[uVar16 + 7] = '\0';
LAB_0016662a:
  if ((uint)puVar4[uVar16 + 7] + (unaff_EBP - uVar14) == pPage->nFree) {
    *(ushort *)(puVar4 + uVar16 + 5) = (ushort)unaff_EBP << 8 | (ushort)unaff_EBP >> 8;
    (puVar4 + uVar16 + 1)[0] = '\0';
    (puVar4 + uVar16 + 1)[1] = '\0';
    iVar18 = 0;
    memset(puVar4 + uVar14,0,(long)(int)(unaff_EBP - uVar14));
  }
  else {
    iVar18 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfcbe,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
  return iVar18;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}